

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::TaskSet::Task::destroy(Task *this)

{
  PromiseArenaMember *node;
  Task *node_00;
  
  node = &((this->node).ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->node).ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  node_00 = (this->next).ptr.ptr;
  if (node_00 != (Task *)0x0) {
    (this->next).ptr.ptr = (Task *)0x0;
    kj::_::PromiseDisposer::dispose(&node_00->super_PromiseArenaMember);
  }
  kj::_::Event::~Event(&this->super_Event);
  return;
}

Assistant:

void destroy() override { freePromise(this); }